

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O3

Token * __thiscall Tokenizer::getNextToken(Token *__return_storage_ptr__,Tokenizer *this)

{
  tokenValue *__rhs;
  __node_base *p_Var1;
  char cVar2;
  TokenType TVar3;
  _Hash_node_base *p_Var4;
  _Storage<char,_true> _Var5;
  _Optional_base<char,_true,_true> _Var6;
  int iVar7;
  long *plVar8;
  iterator iVar9;
  iterator iVar10;
  size_type *psVar11;
  undefined4 *puVar12;
  undefined4 *puVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long lVar15;
  byte bVar16;
  char c;
  unordered_map<char,_TokenType,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_TokenType>_>_>
  singleChars;
  string nextTwo;
  _Storage<char,_true> local_2fd;
  TokenType local_2fc;
  undefined1 local_2f7;
  undefined1 local_2f6;
  undefined1 local_2f5;
  TokenType local_2f4;
  _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_2f0;
  key_type local_2b8;
  TokenType local_294 [11];
  undefined1 local_268 [24];
  undefined1 auStack_250 [16];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  pStack_240;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_218;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_1c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_178;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_150;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
  local_88;
  undefined1 local_60 [8];
  _Variadic_union<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  local_58;
  undefined1 local_38;
  
  bVar16 = 0;
  if (this->parsingHeaderBlock == true) {
    getNextHeaderToken((Token *)local_268,this);
    (this->currentToken).type = local_268._0_4_;
    local_2f0._M_buckets = (__buckets_ptr)&(this->currentToken).value;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr[(ulong)pStack_240.first._M_dataplus._M_p & 0xff]._M_data)
              ((anon_class_8_1_8991fb9c *)&local_2f0,
               (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)(local_268 + 8));
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
      ::_S_vtable._M_arr[(ulong)pStack_240.first._M_dataplus._M_p & 0xff]._M_data)
              ((anon_class_1_0_00000001 *)&local_2f0,
               (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                *)(local_268 + 8));
  }
  else {
    _Var6._M_payload.super__Optional_payload_base<char> =
         (_Optional_payload<char,_true,_true,_true>)next(this);
    if (((ushort)_Var6._M_payload.super__Optional_payload_base<char> >> 8 & 1) == 0) {
      local_268._0_4_ = Eof;
      local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
      pStack_240.first._M_dataplus._M_p = pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
      (this->currentToken).type = Eof;
      local_2f0._M_buckets = (__buckets_ptr)&(this->currentToken).value;
      std::operator=(&local_2f0,
                     (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                      *)(local_268 + 8),&local_2b8);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
        ::_S_vtable._M_arr[(ulong)pStack_240.first._M_dataplus._M_p & 0xff]._M_data)
                ((anon_class_1_0_00000001 *)&local_2f0,
                 (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  *)(local_268 + 8));
    }
    else {
      do {
        _Var5._M_value = _Var6._M_payload.super__Optional_payload_base<char>._M_payload;
        iVar7 = isspace((int)_Var5._M_value);
        local_2fd._M_value = _Var5._M_value;
        if (iVar7 == 0) {
          if (_Var5._M_value == '\0') {
            local_268._0_4_ = Eof;
            local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
            pStack_240.first._M_dataplus._M_p =
                 pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
            (this->currentToken).type = Eof;
            local_2f0._M_buckets = (__buckets_ptr)&(this->currentToken).value;
            std::operator=(&local_2f0,
                           (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                            *)(local_268 + 8),&local_2b8);
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
              ::_S_vtable._M_arr[(ulong)pStack_240.first._M_dataplus._M_p & 0xff]._M_data)
                      ((anon_class_1_0_00000001 *)&local_2f0,
                       (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                        *)(local_268 + 8));
          }
          else {
            pStack_240.first._M_string_length = 0x80000002c;
            pStack_240.first.field_2._M_allocated_capacity = 0x90000002e;
            auStack_250._8_8_ = 0x60000003b;
            pStack_240.first._M_dataplus._M_p = (pointer)0x70000003a;
            local_268._16_8_ = 0x40000007b;
            auStack_250._0_8_ = 0x50000007d;
            local_268._0_8_ = (pointer)0x28;
            local_268._8_4_ = 0x29;
            local_268._12_4_ = 1;
            std::
            _Hashtable<char,std::pair<char_const,TokenType>,std::allocator<std::pair<char_const,TokenType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_Hashtable<std::pair<char_const,TokenType>const*>
                      ((_Hashtable<char,std::pair<char_const,TokenType>,std::allocator<std::pair<char_const,TokenType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&local_2f0,local_268,(undefined1 *)((long)&pStack_240.first.field_2 + 8),0
                       ,&local_2b8,&local_2fc,&local_2f4);
            if (local_2f0._M_buckets[(ulong)(long)local_2fd._M_value % local_2f0._M_bucket_count] !=
                (__node_base_ptr)0x0) {
              p_Var4 = local_2f0._M_buckets
                       [(ulong)(long)local_2fd._M_value % local_2f0._M_bucket_count]->_M_nxt;
              cVar2 = *(char *)&p_Var4[1]._M_nxt;
              do {
                if (local_2fd._M_value == cVar2) {
                  TVar3 = *(TokenType *)((long)&p_Var4[1]._M_nxt + 4);
                  local_268._0_4_ = TVar3;
                  local_268._8_8_ = (ulong)(uint)local_268._12_4_ << 0x20;
                  pStack_240.first._M_dataplus._M_p =
                       pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
                  (this->currentToken).type = TVar3;
                  __rhs = &(this->currentToken).value;
                  local_2b8._M_dataplus._M_p = (pointer)__rhs;
                  std::operator=(&local_2b8,
                                 (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                  *)(local_268 + 8),&local_2fc);
                  (*std::__detail::__variant::
                    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
                    ::_S_vtable._M_arr[(ulong)pStack_240.first._M_dataplus._M_p & 0xff]._M_data)
                            ((anon_class_1_0_00000001 *)&local_2b8,
                             (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                              *)(local_268 + 8));
                  __return_storage_ptr__->type = (this->currentToken).type;
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                     *)&__return_storage_ptr__->value,
                                    (_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                     *)__rhs);
                  std::
                  _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::~_Hashtable(&local_2f0);
                  return __return_storage_ptr__;
                }
                p_Var4 = p_Var4->_M_nxt;
              } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                      (cVar2 = *(char *)&p_Var4[1]._M_nxt,
                      (ulong)(long)cVar2 % local_2f0._M_bucket_count ==
                      (ulong)(long)local_2fd._M_value % local_2f0._M_bucket_count));
            }
            std::
            _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable(&local_2f0);
            if ((ulong)(long)this->pos < (this->program)._M_string_length) {
              p_Var1 = &local_2f0._M_before_begin;
              local_2f0._M_bucket_count = 0;
              local_2f0._M_before_begin._M_nxt._0_1_ = 0;
              local_2f0._M_buckets = &p_Var1->_M_nxt;
              plVar8 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_2f0,0,0,'\x01');
              psVar11 = (size_type *)(plVar8 + 2);
              if ((size_type *)*plVar8 == psVar11) {
                local_268._16_8_ = *psVar11;
                auStack_250._0_8_ = plVar8[3];
                local_268._0_8_ = local_268 + 0x10;
              }
              else {
                local_268._16_8_ = *psVar11;
                local_268._0_8_ = (size_type *)*plVar8;
              }
              local_268._8_8_ = plVar8[1];
              *plVar8 = (long)psVar11;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              plVar8 = (long *)std::__cxx11::string::_M_replace_aux
                                         ((ulong)local_268,local_268._8_8_,0,'\x01');
              local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
              psVar11 = (size_type *)(plVar8 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar8 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar11) {
                local_2b8.field_2._M_allocated_capacity = *psVar11;
                local_2b8.field_2._8_8_ = plVar8[3];
              }
              else {
                local_2b8.field_2._M_allocated_capacity = *psVar11;
                local_2b8._M_dataplus._M_p = (pointer)*plVar8;
              }
              local_2b8._M_string_length = plVar8[1];
              *plVar8 = (long)psVar11;
              plVar8[1] = 0;
              *(undefined1 *)(plVar8 + 2) = 0;
              if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
                operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
              }
              if ((__node_base *)local_2f0._M_buckets != p_Var1) {
                operator_delete(local_2f0._M_buckets,
                                CONCAT71(local_2f0._M_before_begin._M_nxt._1_7_,
                                         local_2f0._M_before_begin._M_nxt._0_1_) + 1);
              }
              iVar7 = std::__cxx11::string::compare((char *)&local_2b8);
              if (iVar7 == 0) {
                next(this);
                this->parsingHeaderBlock = true;
                std::__cxx11::string::operator=((string *)&this->header_block_name,"");
                local_58._M_rest._0_8_ = (undefined8)((long)&local_58 + 0x10);
                auStack_250._0_8_ = (ulong)local_2f0._M_before_begin._M_nxt._1_7_ << 8;
                local_58._24_8_ = local_2f0._M_element_count;
                local_2f0._M_bucket_count = 0;
                local_2f0._M_before_begin._M_nxt._0_1_ = 0;
                local_38 = 2;
                local_268._8_8_ = auStack_250;
                local_268._0_4_ = 0x29;
                pStack_240.first._M_dataplus._M_p._0_1_ = 2;
                auStack_250._8_8_ = local_2f0._M_element_count;
                local_268._16_8_ = 0;
                local_58._8_8_ = 0;
                local_58._16_8_ = (ulong)local_2f0._M_before_begin._M_nxt._1_7_ << 8;
                local_2f0._M_buckets = &p_Var1->_M_nxt;
                Token::operator=(&this->currentToken,(Token *)local_268);
                Token::~Token((Token *)local_268);
                std::__detail::__variant::
                _Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                ::~_Variant_storage((_Variant_storage<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                     *)&local_58._M_first);
                if ((__node_base *)local_2f0._M_buckets != p_Var1) {
                  operator_delete(local_2f0._M_buckets,
                                  CONCAT71(local_2f0._M_before_begin._M_nxt._1_7_,
                                           local_2f0._M_before_begin._M_nxt._0_1_) + 1);
                }
              }
              else {
                local_2fc = Increment;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                            *)local_268,(char (*) [3])"++",&local_2fc);
                local_2f4 = Decrement;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&pStack_240,(char (*) [3])"--",&local_2f4);
                local_294[10] = 0x13;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_218,(char (*) [3])"+=",local_294 + 10);
                local_294[9] = 0x14;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_1f0,(char (*) [3])"-=",local_294 + 9);
                local_294[8] = 0x15;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_1c8,(char (*) [3])"*=",local_294 + 8);
                local_294[7] = 0x16;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_1a0,(char (*) [3])"/=",local_294 + 7);
                local_294[6] = 0x17;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_178,(char (*) [3])"%=",local_294 + 6);
                local_294[5] = 0x1a;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_150,(char (*) [3])"<=",local_294 + 5);
                local_294[4] = 0x1b;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_128,(char (*) [3])">=",local_294 + 4);
                local_294[3] = 0x1c;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_100,(char (*) [3])"==",local_294 + 3);
                local_294[2] = 0x1e;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_d8,(char (*) [3])"&&",local_294 + 2);
                local_294[1] = 0x1f;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>
                          (&local_b0,(char (*) [3])"||",local_294 + 1);
                local_294[0] = NotEquals;
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>
                ::pair<const_char_(&)[3],_TokenType,_true>(&local_88,(char (*) [3])"!=",local_294);
                std::
                _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                ::_Hashtable<std::pair<std::__cxx11::string_const,TokenType>const*>
                          ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,TokenType>,std::allocator<std::pair<std::__cxx11::string_const,TokenType>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                            *)&local_2f0,local_268,local_60,0,&local_2f5,&local_2f6,&local_2f7);
                lVar15 = -0x208;
                paVar14 = &local_88.first.field_2;
                do {
                  if (paVar14 !=
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar14->_M_allocated_capacity)[-2]) {
                    operator_delete((long *)(&paVar14->_M_allocated_capacity)[-2],
                                    paVar14->_M_allocated_capacity + 1);
                  }
                  paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(&paVar14->_M_allocated_capacity + -5);
                  lVar15 = lVar15 + 0x28;
                } while (lVar15 != 0);
                iVar9 = std::
                        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)&local_2f0,&local_2b8);
                if (iVar9.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                    ._M_cur != (__node_type *)0x0) {
                  next(this);
                  local_268._0_4_ =
                       *(undefined4 *)
                        ((long)iVar9.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_true>
                               ._M_cur + 0x28);
                  local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
                  pStack_240.first._M_dataplus._M_p =
                       pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
                  Token::operator=(&this->currentToken,(Token *)local_268);
                  Token::~Token((Token *)local_268);
                  __return_storage_ptr__->type = (this->currentToken).type;
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                     *)&__return_storage_ptr__->value,
                                    (_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                     *)&(this->currentToken).value);
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&local_2f0);
                  goto LAB_00107076;
                }
                std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&local_2f0);
                puVar12 = &DAT_00119284;
                puVar13 = (undefined4 *)local_268;
                for (lVar15 = 0x1c; lVar15 != 0; lVar15 = lVar15 + -1) {
                  *puVar13 = *puVar12;
                  puVar12 = puVar12 + (ulong)bVar16 * -2 + 1;
                  puVar13 = puVar13 + (ulong)bVar16 * -2 + 1;
                }
                std::
                _Hashtable<char,std::pair<char_const,TokenType>,std::allocator<std::pair<char_const,TokenType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_Hashtable<std::pair<char_const,TokenType>const*>
                          ((_Hashtable<char,std::pair<char_const,TokenType>,std::allocator<std::pair<char_const,TokenType>>,std::__detail::_Select1st,std::equal_to<char>,std::hash<char>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)&local_2f0,local_268,&local_218.second,0,&local_2fc,&local_2f4,
                           local_294 + 10);
                iVar10 = std::
                         _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(&local_2f0,&local_2fd._M_value);
                if (iVar10.super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>._M_cur
                    != (__node_type *)0x0) {
                  local_268._0_4_ =
                       *(undefined4 *)
                        ((long)iVar10.
                               super__Node_iterator_base<std::pair<const_char,_TokenType>,_false>.
                               _M_cur + 0xc);
                  local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
                  pStack_240.first._M_dataplus._M_p =
                       pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
                  Token::operator=(&this->currentToken,(Token *)local_268);
                  Token::~Token((Token *)local_268);
                  __return_storage_ptr__->type = (this->currentToken).type;
                  std::__detail::__variant::
                  _Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                     *)&__return_storage_ptr__->value,
                                    (_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                     *)&(this->currentToken).value);
                  std::
                  _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::~_Hashtable(&local_2f0);
                  goto LAB_00107076;
                }
                std::
                _Hashtable<char,_std::pair<const_char,_TokenType>,_std::allocator<std::pair<const_char,_TokenType>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::~_Hashtable(&local_2f0);
                if ((int)local_2fd._M_value - 0x30U < 10) {
                  parseNumber((Token *)local_268,this,local_2fd._M_value);
                }
                else if (local_2fd._M_value == '`') {
                  parseURL((Token *)local_268,this);
                }
                else if (local_2fd._M_value == '\'') {
                  parseChar((Token *)local_268,this);
                }
                else if (local_2fd._M_value == '\"') {
                  parseString((Token *)local_268,this,'\"');
                }
                else {
                  parseName((Token *)local_268,this,local_2fd._M_value);
                }
                Token::operator=(&this->currentToken,(Token *)local_268);
                Token::~Token((Token *)local_268);
              }
              __return_storage_ptr__->type = (this->currentToken).type;
              std::__detail::__variant::
              _Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
              ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                 *)&__return_storage_ptr__->value,
                                (_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                                 *)&(this->currentToken).value);
LAB_00107076:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_dataplus._M_p == &local_2b8.field_2) {
                return __return_storage_ptr__;
              }
              operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1
                             );
              return __return_storage_ptr__;
            }
            local_268._0_4_ = Eof;
            local_268._8_8_ = (ulong)(uint)local_268._12_4_ << 0x20;
            pStack_240.first._M_dataplus._M_p =
                 pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
            (this->currentToken).type = Eof;
            local_2f0._M_buckets = (__buckets_ptr)&(this->currentToken).value;
            std::operator=(&local_2f0,
                           (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                            *)(local_268 + 8),&local_2b8);
            (*std::__detail::__variant::
              __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
              ::_S_vtable._M_arr[(ulong)pStack_240.first._M_dataplus._M_p & 0xff]._M_data)
                      ((anon_class_1_0_00000001 *)&local_2f0,
                       (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                        *)(local_268 + 8));
          }
          goto LAB_00106b12;
        }
        _Var6._M_payload.super__Optional_payload_base<char> =
             (_Optional_payload<char,_true,_true,_true>)next(this);
      } while (((ushort)_Var6._M_payload.super__Optional_payload_base<char> >> 8 & 1) != 0);
      local_268._0_4_ = Eof;
      local_268._8_8_ = local_268._8_8_ & 0xffffffff00000000;
      pStack_240.first._M_dataplus._M_p = pStack_240.first._M_dataplus._M_p & 0xffffffffffffff00;
      (this->currentToken).type = Eof;
      local_2f0._M_buckets = (__buckets_ptr)&(this->currentToken).value;
      std::operator=(&local_2f0,
                     (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                      *)(local_268 + 8),&local_2b8);
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>_&>
        ::_S_vtable._M_arr[(ulong)pStack_240.first._M_dataplus._M_p & 0xff]._M_data)
                ((anon_class_1_0_00000001 *)&local_2f0,
                 (variant<int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                  *)(local_268 + 8));
    }
  }
LAB_00106b12:
  __return_storage_ptr__->type = (this->currentToken).type;
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&__return_storage_ptr__->value,
                    (_Copy_ctor_base<false,_int,_double,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_char>
                     *)&(this->currentToken).value);
  return __return_storage_ptr__;
}

Assistant:

Token Tokenizer::getNextToken() {

    if (parsingHeaderBlock) {
        currentToken = getNextHeaderToken();
        return currentToken;
    }
    char c;
    optional<char> _;
    // Get next char of program
    _ = next();
    if (!_.has_value()) {
        currentToken = Token(Eof);
        return currentToken;
    }
    c = _.value();
    // Ignore whitespace
    while (isspace(c)) {
        _ = next();
        if (!_.has_value()) {
            currentToken = Token(Eof);
            return currentToken;
        }
        c = _.value();
    }
    if (!c) {
        currentToken = Token(Eof);
        return currentToken;
    }

    {
        // Find single chars that can't be confused
        unordered_map<char, TokenType> singleChars = {
                {'(', LeftParen},
                {')', RightParen},
                {'{', LeftBrace},
                {'}', RightBrace},
                {';', Semicolon},
                {':', Colon},
                {',', Comma},
                {'.', Dot},
        };
        auto it = singleChars.find(c);

        if (it != singleChars.end()) {
            currentToken = Token(it->second);
            return currentToken;
        }
    }


    _ = peek();
    if (!_.has_value()) {
        currentToken = Token(Eof);
        return currentToken;
    }
    // Find 2-char tokens that could be confused
    string nextTwo = string() + c + _.value();
    if (nextTwo == "[[") {
        next(1);
        parsingHeaderBlock = true;
        header_block_name = "";
        currentToken = Token(HeaderOpener, string());
        return currentToken;
    }
    {
        unordered_map<string, TokenType> doubleChars = {
                {"++", Increment},
                {"--", Decrement},
                {"+=", PlusEquals},
                {"-=", MinusEquals},
                {"*=", MultiplyEquals},
                {"/=", DivideEquals},
                {"%=", ModuloEquals},
                {"<=", LessThanEquals},
                {">=", GreaterThanEquals},
                {"==", DoubleEquals},
                {"&&", And},
                {"||", Or},
                {"!=", NotEquals}
        };
        auto it = doubleChars.find(nextTwo);
        if (it != doubleChars.end()) {
            next(1); // Go one more forward
            currentToken = Token(it->second);
            return currentToken;
        }
    }
    // Find confusable single chars
    {
        unordered_map<char, TokenType> singleChars = {
                {'+', Plus},
                {'-', Minus},
                {'*', Multiply},
                {'/', Divide},
                {'%', Modulo},
                {'=', SingleEquals},
                {'<', LessThan},
                {'>', GreaterThan},
                {'&', BinaryAnd},
                {'|', BinaryOr},
                {'^', BinaryXor},
                {'!', Not},
                {'[', LeftBracket},
                {']', RightBracket},
        };
        auto it = singleChars.find(c);

        if (it != singleChars.end()) {
            currentToken = Token(it->second);
            return currentToken;
        }
    }
    // Integers
    if (isdigit(c)) {
        currentToken = parseNumber(c);
        return currentToken;
    }
    // Strings
    if (c == '"') {
        currentToken = parseString('"');
        return currentToken;
    }
    // URLs
    if (c == '`') {
        currentToken = parseURL();
        return currentToken;
    }
    // Chars
    if (c == '\'') {
        currentToken = parseChar();
        return currentToken;
    }

    currentToken = parseName(c);
    return currentToken;
}